

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_stats.c
# Opt level: O0

void cram_stats_add(cram_stats *st,int32_t val)

{
  int *piVar1;
  khint_t kVar2;
  kh_m_i2i_t *pkVar3;
  int local_1c [2];
  int r;
  khint_t k;
  int32_t val_local;
  cram_stats *st_local;
  
  st->nsamp = st->nsamp + 1;
  if ((val < 0x400) && (-1 < val)) {
    st->freqs[val] = st->freqs[val] + 1;
  }
  else {
    r = val;
    _k = st;
    if (st->h == (kh_m_i2i_t *)0x0) {
      pkVar3 = kh_init_m_i2i();
      _k->h = pkVar3;
    }
    kVar2 = kh_put_m_i2i(_k->h,r,local_1c);
    if (local_1c[0] == 0) {
      piVar1 = _k->h->vals;
      piVar1[kVar2] = piVar1[kVar2] + 1;
    }
    else if (local_1c[0] != -1) {
      _k->h->vals[kVar2] = 1;
    }
  }
  return;
}

Assistant:

void cram_stats_add(cram_stats *st, int32_t val) {
    st->nsamp++;

    //assert(val >= 0);

    if (val < MAX_STAT_VAL && val >= 0) {
	st->freqs[val]++;
    } else {
	khint_t k;
	int r;

	if (!st->h) {
	    st->h = kh_init(m_i2i);
	}

	k = kh_put(m_i2i, st->h, val, &r);
	if (r == 0)
	    kh_val(st->h, k)++;
	else if (r != -1)
	    kh_val(st->h, k) = 1;
	else
	    ; // FIXME: handle error
    }
}